

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::checkForCorruption
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *file,size_t line,
          TestMemoryAllocator *allocator,bool allocateNodesSeperately)

{
  bool bVar1;
  int iVar2;
  TestMemoryAllocator *alloc_allocator;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool allocateNodesSeperately_local;
  TestMemoryAllocator *allocator_local;
  size_t line_local;
  char *file_local;
  MemoryLeakDetectorNode *node_local;
  MemoryLeakDetector *this_local;
  
  alloc_allocator = (TestMemoryAllocator *)(**(code **)(**(long **)(node + 0x28) + 0x50))();
  iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])();
  bVar1 = matchingAllocation(this,alloc_allocator,
                             (TestMemoryAllocator *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    bVar1 = validMemoryCorruptionInformation(this,(char *)(*(long *)(node + 0x10) + *(long *)node));
    if (bVar1) {
      if (allocateNodesSeperately) {
        (*allocator->_vptr_TestMemoryAllocator[9])(allocator,node);
      }
    }
    else {
      iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])();
      MemoryLeakOutputStringBuffer::reportMemoryCorruptionFailure
                (&this->outputBuffer_,node,file,line,
                 (TestMemoryAllocator *)CONCAT44(extraout_var_01,iVar2),this->reporter_);
    }
  }
  else {
    iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])();
    MemoryLeakOutputStringBuffer::reportAllocationDeallocationMismatchFailure
              (&this->outputBuffer_,node,file,line,
               (TestMemoryAllocator *)CONCAT44(extraout_var_00,iVar2),this->reporter_);
  }
  return;
}

Assistant:

void MemoryLeakDetector::checkForCorruption(MemoryLeakDetectorNode* node, const char* file, size_t line, TestMemoryAllocator* allocator, bool allocateNodesSeperately)
{
    if (!matchingAllocation(node->allocator_->actualAllocator(), allocator->actualAllocator()))
        outputBuffer_.reportAllocationDeallocationMismatchFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (!validMemoryCorruptionInformation(node->memory_ + node->size_))
        outputBuffer_.reportMemoryCorruptionFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (allocateNodesSeperately)
        allocator->freeMemoryLeakNode((char*) node);
}